

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O2

void __thiscall NJamSpell::TPerfectHash::Load(TPerfectHash *this,istream *in)

{
  bool *object;
  void *pvVar1;
  
  Clear(this);
  object = (bool *)operator_new(0x38);
  object[0] = false;
  object[1] = false;
  object[2] = false;
  object[3] = false;
  object[4] = false;
  object[5] = false;
  object[6] = false;
  object[7] = false;
  object[8] = false;
  object[9] = false;
  object[10] = false;
  object[0xb] = false;
  object[0xc] = false;
  object[0xd] = false;
  object[0xe] = false;
  object[0xf] = false;
  object[0x30] = false;
  object[0x31] = false;
  object[0x32] = false;
  object[0x33] = false;
  object[0x34] = false;
  object[0x35] = false;
  object[0x36] = false;
  object[0x37] = false;
  object[0x10] = false;
  object[0x11] = false;
  object[0x12] = false;
  object[0x13] = false;
  object[0x14] = false;
  object[0x15] = false;
  object[0x16] = false;
  object[0x17] = false;
  object[0x18] = false;
  object[0x19] = false;
  object[0x1a] = false;
  object[0x1b] = false;
  object[0x1c] = false;
  object[0x1d] = false;
  object[0x1e] = false;
  object[0x1f] = false;
  object[0x20] = false;
  object[0x21] = false;
  object[0x22] = false;
  object[0x23] = false;
  object[0x24] = false;
  object[0x25] = false;
  object[0x26] = false;
  object[0x27] = false;
  object[0x28] = false;
  object[0x29] = false;
  object[0x2a] = false;
  object[0x2b] = false;
  object[0x2c] = false;
  object[0x2d] = false;
  object[0x2e] = false;
  object[0x2f] = false;
  this->Phf = object;
  NHandyPack::TPodSerializer<unsigned_long>::Load(in,(unsigned_long *)(object + 0x20));
  NHandyPack::
  TPodSerializer<phf::(unnamed_enum_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/contrib/phf/phf.h:144:2)>
  ::Load(in,(anon_enum_32 *)(object + 0x28));
  NHandyPack::TPodSerializer<unsigned_long>::Load(in,(unsigned_long *)(object + 0x10));
  NHandyPack::TPodSerializer<unsigned_long>::Load(in,(unsigned_long *)(object + 8));
  NHandyPack::TPodSerializer<unsigned_int>::Load(in,(uint *)(object + 4));
  NHandyPack::TPodSerializer<bool>::Load(in,object);
  pvVar1 = calloc(*(size_t *)(object + 8),4);
  *(void **)(object + 0x18) = pvVar1;
  std::istream::read((char *)in,(long)pvVar1);
  return;
}

Assistant:

void TPerfectHash::Load(std::istream& in) {
    Clear();
    Phf = new phf();
    phf& perfHash = *(phf*)Phf;
    NHandyPack::Load(in, perfHash.d_max,
                        perfHash.g_op,
                        perfHash.m,
                        perfHash.r,
                        perfHash.seed,
                        perfHash.nodiv);
    perfHash.g = (uint32_t*)calloc(perfHash.r, sizeof(uint32_t));
    in.read((char*)perfHash.g, perfHash.r * sizeof(uint32_t));
}